

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_FillAddClampColumn(void)

{
  int iVar1;
  DWORD DVar2;
  DWORD *pDVar3;
  uint uVar4;
  DWORD b;
  DWORD a;
  int pitch;
  DWORD fg;
  DWORD *bg2rgb;
  BYTE *dest;
  int count;
  
  pDVar3 = dc_destblend;
  DVar2 = dc_srccolor;
  iVar1 = dc_pitch;
  dest._4_4_ = dc_count;
  if (0 < dc_count) {
    bg2rgb = (DWORD *)dc_dest;
    do {
      uVar4 = DVar2 + pDVar3[(byte)*bg2rgb] & 0x40100400;
      uVar4 = uVar4 - (uVar4 >> 5) | DVar2 + pDVar3[(byte)*bg2rgb] & 0x3fffffff | 0x1f07c1f;
      *(BYTE *)bg2rgb = RGB32k.All[uVar4 & uVar4 >> 0xf];
      bg2rgb = (DWORD *)((long)bg2rgb + (long)iVar1);
      dest._4_4_ = dest._4_4_ + -1;
    } while (dest._4_4_ != 0);
  }
  return;
}

Assistant:

void R_FillAddClampColumn (void)
{
	int count;
	BYTE *dest;

	count = dc_count;
	if (count <= 0)
		return;

	dest = dc_dest;
	DWORD *bg2rgb;
	DWORD fg;

	bg2rgb = dc_destblend;
	fg = dc_srccolor;
	int pitch = dc_pitch;

	do
	{
		DWORD a = fg + bg2rgb[*dest];
		DWORD b = a;

		a |= 0x01f07c1f;
		b &= 0x40100400;
		a &= 0x3fffffff;
		b = b - (b >> 5);
		a |= b;
		*dest = RGB32k.All[a & (a>>15)];
		dest += pitch; 
	} while (--count);

}